

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

void Curl_hexencode(uchar *src,size_t len,uchar *out,size_t olen)

{
  size_t sVar1;
  
  if (olen < 3 || (len == 0 || src == (uchar *)0x0)) {
    if (olen == 0) {
      return;
    }
  }
  else {
    sVar1 = 0;
    for (; (len != sVar1 && (2 < olen)); olen = olen - 2) {
      *out = "0123456789abcdef"[src[sVar1] >> 4];
      out[1] = "0123456789abcdef"[src[sVar1] & 0xf];
      out = out + 2;
      sVar1 = sVar1 + 1;
    }
  }
  *out = '\0';
  return;
}

Assistant:

void Curl_hexencode(const unsigned char *src, size_t len, /* input length */
                    unsigned char *out, size_t olen) /* output buffer size */
{
  const char *hex = "0123456789abcdef";
  DEBUGASSERT(src && len && (olen >= 3));
  if(src && len && (olen >= 3)) {
    while(len-- && (olen >= 3)) {
      /* clang-tidy warns on this line without this comment: */
      /* NOLINTNEXTLINE(clang-analyzer-core.UndefinedBinaryOperatorResult) */
      *out++ = hex[(*src & 0xF0)>>4];
      *out++ = hex[*src & 0x0F];
      ++src;
      olen -= 2;
    }
    *out = 0;
  }
  else if(olen)
    *out = 0;
}